

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_uncompress_lzma(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       backtrace_error_callback error_callback,void *data,uchar **uncompressed,
                       size_t *uncompressed_size)

{
  uint16_t *puVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  undefined1 auVar8 [16];
  uint16_t *puVar9;
  size_t sVar10;
  sbyte sVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  byte bVar21;
  size_t off;
  ulong uVar18;
  byte *p;
  uint16_t *probs;
  byte *pbVar19;
  ulong uVar20;
  uint uVar22;
  uint *puVar23;
  ulong uVar24;
  byte *pbVar25;
  size_t __n;
  ulong __n_00;
  byte bVar26;
  uint64_t v;
  ulong uVar27;
  uint32_t i;
  uint uVar28;
  uint uVar29;
  uint32_t i_1;
  uint uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  uint32_t val;
  uint uVar34;
  int iVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong local_c8;
  ulong local_88;
  uint16_t *local_78;
  uint local_70;
  size_t local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint32_t local_34;
  ulong uVar17;
  long lVar38;
  
  if (compressed_size < 0x18) {
    return 0;
  }
  lVar32 = 6;
  iVar12 = bcmp(compressed,anon_var_dwarf_5e76d,6);
  if (iVar12 != 0) {
    return 0;
  }
  if (compressed[6] != '\0') {
    return 0;
  }
  bVar3 = compressed[7];
  if (7 < bVar3) {
    return 0;
  }
  uVar17 = 0xffffffffffffffff;
  do {
    uVar13 = (uint)(uVar17 >> 8) & 0xffffff ^
             *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(compressed[lVar32] ^ (byte)uVar17) * 4)
    ;
    uVar17 = (ulong)uVar13;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 8);
  if ((uVar13 ^ *(uint *)(compressed + 8)) != 0xffffffff) {
    return 0;
  }
  if (*(short *)(compressed + (compressed_size - 2)) != 0x5a59) {
    return 0;
  }
  if (compressed[compressed_size - 4] != '\0') {
    return 0;
  }
  if (compressed[compressed_size - 3] != bVar3) {
    return 0;
  }
  uVar17 = 0xffffffffffffffff;
  lVar32 = -8;
  do {
    uVar13 = (uint)(uVar17 >> 8) & 0xffffff ^
             *(uint *)(elf_crc32_crc32_table +
                      (ulong)(byte)(compressed[lVar32 + compressed_size] ^ (byte)uVar17) * 4);
    uVar17 = (ulong)uVar13;
    lVar32 = lVar32 + 1;
  } while (lVar32 != -2);
  if ((uVar13 ^ *(uint *)(compressed + (compressed_size - 0xc))) != 0xffffffff) {
    return 0;
  }
  if (compressed_size - 0xc < (long)*(int *)(compressed + (compressed_size - 8)) * 4 + 0x10U) {
    return 0;
  }
  lVar32 = compressed_size + (long)*(int *)(compressed + (compressed_size - 8)) * -4;
  if (compressed[lVar32 + -0x10] != '\0') {
    return 0;
  }
  uVar17 = lVar32 - 0x10;
  if (compressed[lVar32 + -0xf] != '\x01') {
    if (compressed[lVar32 + -0xf] != '\0') {
      return 0;
    }
    *uncompressed = (uchar *)0x0;
    *uncompressed_size = 0;
    return 1;
  }
  puVar23 = (uint *)(compressed + lVar32 + -0x10);
  uVar18 = lVar32 - 0xe;
  iVar12 = 0;
  uVar27 = 0;
  while( true ) {
    if (compressed_size <= uVar18) {
      return 0;
    }
    uVar27 = uVar27 | (long)(int)((compressed[uVar18] & 0x7f) << ((byte)iVar12 & 0x1f));
    if (-1 < (char)compressed[uVar18]) break;
    iVar12 = iVar12 + 7;
    uVar18 = uVar18 + 1;
    if (iVar12 == 0x3f) {
      return 0;
    }
  }
  iVar12 = 0;
  local_88 = 0;
  while( true ) {
    uVar18 = uVar18 + 1;
    if (compressed_size <= uVar18) {
      return 0;
    }
    local_88 = local_88 | (long)(int)((compressed[uVar18] & 0x7f) << ((byte)iVar12 & 0x1f));
    if (-1 < (char)compressed[uVar18]) break;
    iVar12 = iVar12 + 7;
    if (iVar12 == 0x3f) {
      return 0;
    }
  }
  uVar18 = uVar18 & 0xfffffffffffffffc;
  uVar13 = 0;
  if (uVar18 + 4 != uVar17 && -1 < (long)((uVar18 + 4) - uVar17)) {
    uVar24 = 0xffffffffffffffff;
    do {
      uVar13 = (uint)(uVar24 >> 8) & 0xffffff ^
               *(uint *)(elf_crc32_crc32_table + (ulong)(byte)((byte)*puVar23 ^ (byte)uVar24) * 4);
      uVar24 = (ulong)uVar13;
      puVar23 = (uint *)((long)puVar23 + 1);
    } while (puVar23 < compressed + uVar18 + 4);
    uVar13 = ~uVar13;
  }
  if (uVar13 != *(uint *)(compressed + uVar18 + 4)) {
    return 0;
  }
  if (uVar18 != compressed_size - 0x14) {
    return 0;
  }
  p = (byte *)tcmalloc_backtrace_alloc(state,local_88,error_callback,data);
  if (p == (byte *)0x0) {
    return 0;
  }
  *uncompressed = p;
  *uncompressed_size = local_88;
  probs = (uint16_t *)tcmalloc_backtrace_alloc(state,0x6e6c,error_callback,data);
  if (probs == (uint16_t *)0x0) goto LAB_001125d8;
  uVar18 = (ulong)((uint)compressed[0xc] * 4);
  if ((compressed_size < uVar18 + 0x10) || (bVar21 = compressed[0xd], (bVar21 & 0x3c) != 0))
  goto LAB_001125d8;
  if ((bVar21 & 0x40) != 0) {
    local_48 = 0xe;
    uVar24 = 0xf;
    do {
      if ((0xe - compressed_size) + uVar24 == 0xf) break;
      sVar10 = 0xe;
      if (-1 < (char)compressed[uVar24 - 1]) goto LAB_00111841;
      uVar24 = uVar24 + 1;
    } while ((int)uVar24 != 0x18);
    goto LAB_001125d8;
  }
  uVar24 = 0xe;
  sVar10 = local_48;
LAB_00111841:
  local_48 = sVar10;
  if ((char)bVar21 < '\0') {
    iVar12 = 9;
    do {
      if (compressed_size <= uVar24) break;
      if (-1 < (char)compressed[uVar24]) {
        uVar24 = uVar24 + 1;
        goto LAB_00111899;
      }
      uVar24 = uVar24 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    goto LAB_001125d8;
  }
LAB_00111899:
  if (((((bVar21 & 3) != 0) || (uVar18 + 0x10 <= uVar24 + 2)) || (compressed[uVar24] != '!')) ||
     ((compressed[uVar24 + 1] != '\x01' || (0x28 < compressed[uVar24 + 2])))) goto LAB_001125d8;
  uVar33 = uVar24 + 3;
  if (uVar24 + 3 < uVar18 + 0xc) {
    do {
      if (compressed[uVar24 + 3] != '\0') goto LAB_001125d8;
      uVar24 = uVar24 + 1;
      uVar33 = uVar18 + 0xc;
    } while (uVar18 + 9 != uVar24);
  }
  if (compressed[0xc] == 0) {
    uVar13 = 0;
  }
  else {
    pbVar25 = compressed + 0xc;
    pbVar19 = pbVar25 + uVar18;
    uVar18 = 0xffffffffffffffff;
    do {
      uVar13 = (uint)(uVar18 >> 8) & 0xffffff ^
               *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(*pbVar25 ^ (byte)uVar18) * 4);
      uVar18 = (ulong)uVar13;
      pbVar25 = pbVar25 + 1;
    } while (pbVar25 < pbVar19);
    uVar13 = ~uVar13;
  }
  if (uVar13 != *(uint *)(compressed + uVar33)) goto LAB_001125d8;
  uVar33 = uVar33 + 4;
  if (uVar33 < compressed_size) {
    puVar1 = probs + 0x736;
    uVar18 = 0;
    local_c8 = 0;
    bVar21 = 0;
    uVar14 = 0;
    sVar11 = 0;
    uVar13 = 0;
    local_78 = puVar1;
    do {
      auVar8 = _DAT_0012d0b0;
      local_34 = 0xffffffff;
      bVar4 = compressed[uVar33];
      if (bVar4 == 0) {
        uVar33 = uVar33 + 1;
        break;
      }
      if (0xdf < bVar4) {
        local_c8 = uVar18;
      }
      if (bVar4 == 1) {
        local_c8 = uVar18;
      }
      if ((char)bVar4 < '\0') {
        uVar24 = uVar33 + 5;
        if (compressed_size <= uVar24) goto LAB_001125d8;
        bVar5 = compressed[uVar33 + 1];
        bVar6 = compressed[uVar33 + 2];
        uVar7 = *(ushort *)(compressed + uVar33 + 3);
        if (bVar4 < 0xc0) {
          if (0x9f < bVar4) goto LAB_00111b06;
        }
        else {
          bVar21 = compressed[uVar33 + 5];
          if (0xe0 < bVar21) goto LAB_001125d8;
          sVar11 = 0;
          if (0x2c < bVar21) {
            bVar26 = bVar21 - 0x2d;
            bVar21 = bVar26 % 0x2d;
            sVar11 = bVar26 / 0x2d + 1;
          }
          uVar14 = 0;
          if (9 < bVar21) {
            bVar26 = bVar21 - 10;
            bVar21 = bVar26 % 9 + 1;
            uVar14 = (uint)(byte)(bVar26 / 9 + 1);
          }
          if (4 < uVar14 + bVar21) goto LAB_001125d8;
          uVar24 = uVar33 + 6;
LAB_00111b06:
          lVar32 = 7;
          auVar37 = _DAT_0012d0a0;
          auVar39 = _DAT_001308b0;
          auVar40 = _DAT_001308a0;
          auVar41 = _DAT_00130890;
          do {
            auVar42 = auVar37 ^ auVar8;
            iVar12 = auVar42._0_4_;
            iVar15 = auVar42._8_4_;
            auVar47._4_4_ = iVar12;
            auVar47._0_4_ = iVar12;
            auVar47._8_4_ = iVar15;
            auVar47._12_4_ = iVar15;
            auVar51._0_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar51._4_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar51._8_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar51._12_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar43._0_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar43._4_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar43._8_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar43._12_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar43 = auVar43 & auVar51;
            auVar42 = pshuflw(auVar47,auVar43,0xe8);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              probs[lVar32 + -7] = 0x400;
            }
            auVar42 = packssdw(auVar43,auVar43);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42._0_4_ >> 0x10 & 1) != 0) {
              probs[lVar32 + -6] = 0x400;
            }
            auVar42 = auVar39 ^ auVar8;
            iVar12 = auVar42._0_4_;
            iVar15 = auVar42._8_4_;
            auVar48._4_4_ = iVar12;
            auVar48._0_4_ = iVar12;
            auVar48._8_4_ = iVar15;
            auVar48._12_4_ = iVar15;
            auVar52._0_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar52._4_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar52._8_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar52._12_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar44._0_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar44._4_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar44._8_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar44._12_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar44 = auVar44 & auVar52;
            auVar42 = packssdw(auVar48,auVar44);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              probs[lVar32 + -5] = 0x400;
            }
            auVar42 = pshufhw(auVar44,auVar44,0x84);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              probs[lVar32 + -4] = 0x400;
            }
            auVar42 = auVar40 ^ auVar8;
            iVar12 = auVar42._0_4_;
            iVar15 = auVar42._8_4_;
            auVar49._4_4_ = iVar12;
            auVar49._0_4_ = iVar12;
            auVar49._8_4_ = iVar15;
            auVar49._12_4_ = iVar15;
            auVar53._0_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar53._4_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar53._8_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar53._12_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar45._0_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar45._4_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar45._8_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar45._12_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar45 = auVar45 & auVar53;
            auVar42 = pshuflw(auVar49,auVar45,0xe8);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              probs[lVar32 + -3] = 0x400;
            }
            auVar42 = packssdw(auVar45,auVar45);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              probs[lVar32 + -2] = 0x400;
            }
            auVar42 = auVar41 ^ auVar8;
            iVar12 = auVar42._0_4_;
            iVar15 = auVar42._8_4_;
            auVar50._4_4_ = iVar12;
            auVar50._0_4_ = iVar12;
            auVar50._8_4_ = iVar15;
            auVar50._12_4_ = iVar15;
            auVar54._0_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar54._4_4_ = -(uint)(iVar12 < -0x7fffc8ca);
            auVar54._8_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar54._12_4_ = -(uint)(iVar15 < -0x7fffc8ca);
            auVar46._0_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar46._4_4_ = -(uint)(auVar42._4_4_ == -0x80000000);
            auVar46._8_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar46._12_4_ = -(uint)(auVar42._12_4_ == -0x80000000);
            auVar46 = auVar46 & auVar54;
            auVar42 = packssdw(auVar50,auVar46);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              probs[lVar32 + -1] = 0x400;
            }
            auVar42 = pshufhw(auVar46,auVar46,0x84);
            auVar42 = packssdw(auVar42,auVar42);
            if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              probs[lVar32] = 0x400;
            }
            lVar38 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 8;
            auVar37._8_8_ = lVar38 + 8;
            lVar38 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 8;
            auVar39._8_8_ = lVar38 + 8;
            lVar38 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 8;
            auVar40._8_8_ = lVar38 + 8;
            lVar38 = auVar41._8_8_;
            auVar41._0_8_ = auVar41._0_8_ + 8;
            auVar41._8_8_ = lVar38 + 8;
            lVar32 = lVar32 + 8;
          } while (lVar32 != 0x373f);
          local_70 = 0;
          local_3c = 0;
          local_40 = 0;
          local_78 = (uint16_t *)0x0;
          uVar13 = 0;
        }
        local_34 = 0xffffffff;
        uVar33 = uVar24 + 5;
        if (compressed_size < uVar33) goto LAB_001125d8;
        uVar34 = *(uint *)(compressed + uVar24 + 1);
        local_38 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 |
                   uVar34 << 0x18;
        uVar24 = (ulong)(ushort)(uVar7 << 8 | uVar7 >> 8) + 1 + uVar33;
        local_48 = uVar33;
        if ((uVar33 < uVar24) &&
           (uVar20 = (ulong)bVar6 + ((bVar4 & 0x1f) << 0x10) + uVar18 + (ulong)bVar5 * 0x100 + 1,
           uVar18 != uVar20)) {
          do {
            uVar22 = (uint)(uVar18 - local_c8);
            uVar30 = uVar22 & ~(-1 << sVar11);
            uVar28 = uVar13 * 0x10 + uVar30;
            iVar12 = elf_lzma_bit(compressed,compressed_size,probs + uVar28,&local_48,&local_34,
                                  &local_38);
            uVar34 = (uint)local_78;
            if (iVar12 == 0) {
              if (uVar18 == 0) {
                uVar28 = 0;
              }
              else {
                uVar28 = (uint)p[uVar18 - 1];
              }
              lVar32 = ((ulong)(uVar22 & ~(-1 << ((byte)uVar14 & 0x1f))) << (bVar21 & 0x3f)) +
                       (ulong)(uVar28 >> (8 - bVar21 & 0x1f));
              if (uVar13 < 7) {
                iVar12 = 8;
                uVar33 = 1;
                do {
                  iVar15 = elf_lzma_bit(compressed,compressed_size,puVar1 + lVar32 * 0x300 + uVar33,
                                        &local_48,&local_34,&local_38);
                  uVar29 = iVar15 + (int)uVar33 * 2;
                  uVar33 = (ulong)uVar29;
                  iVar12 = iVar12 + -1;
                } while (iVar12 != 0);
                uVar29 = uVar29 - 0x100;
              }
              else {
                uVar28 = 0;
                if (uVar34 + 1 <= uVar18) {
                  uVar28 = (uint)p[~((ulong)local_78 & 0xffffffff) + uVar18] * 2;
                }
                uVar34 = 0x100;
                uVar22 = 1;
                do {
                  uVar30 = uVar34 & uVar28;
                  uVar28 = uVar28 * 2;
                  iVar12 = elf_lzma_bit(compressed,compressed_size,
                                        puVar1 + lVar32 * 0x300 + (ulong)(uVar34 + uVar22 + uVar30),
                                        &local_48,&local_34,&local_38);
                  if (iVar12 != 0) {
                    uVar34 = 0;
                  }
                  uVar29 = iVar12 + uVar22 * 2;
                  uVar34 = uVar34 ^ uVar30;
                  bVar36 = uVar22 < 0x80;
                  uVar22 = uVar29;
                } while (bVar36);
              }
              if (local_88 <= uVar18) goto LAB_001125d8;
              p[uVar18] = (byte)uVar29;
              uVar18 = uVar18 + 1;
              if (uVar13 < 4) {
                uVar13 = 0;
              }
              else if (uVar13 < 10) {
                uVar13 = uVar13 - 3;
              }
              else {
                uVar13 = uVar13 - 6;
              }
            }
            else {
              iVar12 = elf_lzma_bit(compressed,compressed_size,probs + (uVar13 + 0xc0),&local_48,
                                    &local_34,&local_38);
              if (iVar12 == 0) {
                uVar28 = elf_lzma_len(compressed,compressed_size,probs,0,uVar30,&local_48,&local_34,
                                      &local_38);
                uVar22 = uVar28 * 0x40 + 0x130;
                if (5 < uVar28) {
                  uVar22 = 0x270;
                }
                iVar12 = 6;
                uVar33 = 1;
                do {
                  uVar30 = elf_lzma_bit(compressed,compressed_size,probs + uVar22 + uVar33,&local_48
                                        ,&local_34,&local_38);
                  local_70 = local_3c;
                  uVar29 = uVar30 + (int)uVar33 * 2;
                  uVar33 = (ulong)uVar29;
                  iVar12 = iVar12 + -1;
                } while (iVar12 != 0);
                uVar13 = (uint)(6 < uVar13) * 3 + 7;
                uVar22 = uVar29 - 0x40;
                if (uVar22 < 4) {
                  local_3c = local_40;
                }
                else {
                  uVar30 = uVar30 | 2;
                  if (uVar22 < 0xe) {
                    iVar31 = (uVar22 >> 1) - 1;
                    iVar12 = uVar30 << ((byte)iVar31 & 0x1f);
                    iVar15 = 0;
                    uVar33 = 1;
                    iVar35 = 0;
                    do {
                      iVar16 = elf_lzma_bit(compressed,compressed_size,
                                            probs + ((iVar12 - uVar29) + 0x2ef) + uVar33,&local_48,
                                            &local_34,&local_38);
                      uVar33 = (ulong)(uint)(iVar16 + (int)uVar33 * 2);
                      iVar35 = iVar35 + (iVar16 << ((byte)iVar15 & 0x1f));
                      iVar15 = iVar15 + 1;
                    } while (iVar31 != iVar15);
                    uVar22 = iVar35 + iVar12;
                  }
                  else {
                    for (iVar12 = (uVar22 >> 1) - 5; iVar12 != 0; iVar12 = iVar12 + -1) {
                      if (local_48 < compressed_size && local_34 < 0x1000000) {
                        local_34 = local_34 << 8;
                        local_38 = local_38 << 8 | (uint)compressed[local_48];
                        local_48 = local_48 + 1;
                      }
                      local_34 = local_34 >> 1;
                      uVar22 = (int)(local_38 - local_34) >> 0x1f;
                      uVar30 = uVar22 + uVar30 * 2 + 1;
                      local_38 = (uVar22 & local_34) + (local_38 - local_34);
                    }
                    iVar12 = 0;
                    uVar33 = 1;
                    iVar15 = 0;
                    do {
                      iVar31 = elf_lzma_bit(compressed,compressed_size,probs + uVar33 + 0x322,
                                            &local_48,&local_34,&local_38);
                      uVar33 = (ulong)(uint)(iVar31 + (int)uVar33 * 2);
                      iVar15 = iVar15 + (iVar31 << ((byte)iVar12 & 0x1f));
                      iVar12 = iVar12 + 1;
                    } while (iVar12 != 4);
                    uVar22 = iVar15 + uVar30 * 0x10;
                  }
                  local_70 = local_3c;
                  local_3c = local_40;
                }
                local_78 = (uint16_t *)(ulong)uVar22;
                local_40 = uVar34;
              }
              else {
                iVar12 = elf_lzma_bit(compressed,compressed_size,probs + (uVar13 + 0xcc),&local_48,
                                      &local_34,&local_38);
                if (iVar12 == 0) {
                  iVar12 = elf_lzma_bit(compressed,compressed_size,probs + (uVar28 + 0xf0),&local_48
                                        ,&local_34,&local_38);
                  bVar36 = 6 < uVar13;
                  uVar13 = iVar12 == 0 | 8;
                  if (bVar36) {
                    uVar13 = 0xb;
                  }
                  uVar28 = 1;
                  puVar9 = (uint16_t *)((ulong)local_78 & 0xffffffff);
                  if (iVar12 == 0) goto LAB_0011238a;
                }
                else {
                  iVar12 = elf_lzma_bit(compressed,compressed_size,probs + (uVar13 + 0xd8),&local_48
                                        ,&local_34,&local_38);
                  uVar28 = local_3c;
                  uVar22 = local_70;
                  if ((iVar12 != 0) &&
                     (iVar12 = elf_lzma_bit(compressed,compressed_size,probs + (uVar13 + 0xe4),
                                            &local_48,&local_34,&local_38), uVar28 = local_40,
                     local_40 = local_70, uVar22 = local_3c, iVar12 == 0)) {
                    local_40 = local_3c;
                    uVar22 = local_70;
                  }
                  local_70 = uVar22;
                  uVar13 = (uint)(6 < uVar13) * 3 + 8;
                  puVar9 = (uint16_t *)(ulong)local_40;
                  local_40 = uVar34;
                  local_3c = uVar28;
                }
                local_78 = puVar9;
                uVar28 = elf_lzma_len(compressed,compressed_size,probs,1,uVar30,&local_48,&local_34,
                                      &local_38);
              }
LAB_0011238a:
              uVar34 = (int)local_78 + 1;
              if (uVar18 - local_c8 < (ulong)uVar34) goto LAB_001125d8;
              __n_00 = (ulong)uVar28;
              uVar33 = uVar18 + __n_00;
              if (local_88 < uVar33) goto LAB_001125d8;
              if ((int)local_78 == 0) {
                memset(p + uVar18,(uint)p[uVar18 - 1],__n_00);
                local_78 = (uint16_t *)0x0;
                uVar18 = uVar33;
              }
              else if (uVar34 < uVar28) {
                do {
                  uVar22 = uVar34;
                  if (uVar28 < uVar34) {
                    uVar22 = uVar28;
                  }
                  memcpy(p + uVar18,p + uVar18 + (-1 - ((ulong)local_78 & 0xffffffff)),(ulong)uVar22
                        );
                  uVar18 = uVar18 + uVar22;
                  uVar28 = uVar28 - uVar22;
                } while (uVar28 != 0);
              }
              else {
                memcpy(p + uVar18,p + uVar18 + ~((ulong)local_78 & 0xffffffff),__n_00);
                uVar18 = uVar33;
              }
            }
          } while ((local_48 < uVar24) && (uVar18 != uVar20));
          uVar33 = local_48;
          if (local_48 < compressed_size && local_34 < 0x1000000) {
            local_34 = local_34 << 8;
            local_38 = (uint)compressed[local_48] | local_38 << 8;
            uVar33 = local_48 + 1;
            local_48 = uVar33;
          }
        }
      }
      else {
        if ((2 < bVar4) || (uVar24 = uVar33 + 3, compressed_size < uVar24)) goto LAB_001125d8;
        uVar20 = (ulong)(ushort)(*(ushort *)(compressed + uVar33 + 1) << 8 |
                                *(ushort *)(compressed + uVar33 + 1) >> 8);
        uVar33 = uVar20 + uVar24 + 1;
        if (compressed_size < uVar33) goto LAB_001125d8;
        __n = uVar20 + 1;
        uVar20 = __n + uVar18;
        if (local_88 < uVar20) goto LAB_001125d8;
        memcpy(p + uVar18,compressed + uVar24,__n);
        uVar18 = uVar20;
      }
    } while (uVar33 < compressed_size);
  }
  else {
    uVar18 = 0;
  }
  uVar24 = uVar33 + 3 & 0xfffffffffffffffc;
  if (compressed_size < uVar24) goto LAB_001125d8;
  if (bVar3 != 0) {
    if (bVar3 == 10) {
      uVar24 = uVar24 + 0x20;
    }
    else {
      if (bVar3 != 4) {
        if ((bVar3 != 1) || (compressed_size < uVar24 + 4)) goto LAB_001125d8;
        if ((long)uVar18 < 1) {
          uVar13 = 0;
        }
        else {
          uVar20 = 0xffffffffffffffff;
          pbVar25 = p;
          do {
            uVar13 = (uint)(uVar20 >> 8) & 0xffffff ^
                     *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(*pbVar25 ^ (byte)uVar20) * 4);
            uVar20 = (ulong)uVar13;
            pbVar25 = pbVar25 + 1;
          } while (pbVar25 < p + uVar18);
          uVar13 = ~uVar13;
        }
        puVar2 = compressed + uVar24;
        lVar32 = uVar24 + 2;
        uVar24 = uVar24 + 4;
        if (uVar13 != CONCAT13(compressed[uVar33 + 3 | 3],
                               CONCAT12(compressed[lVar32],*(undefined2 *)puVar2)))
        goto LAB_001125d8;
        goto LAB_00112574;
      }
      uVar24 = uVar24 + 8;
    }
    if (compressed_size < uVar24) goto LAB_001125d8;
  }
LAB_00112574:
  if ((uVar24 - 0xc == (uVar27 + 3 & 0xfffffffffffffffc)) && (uVar24 == uVar17)) {
    return 1;
  }
LAB_001125d8:
  tcmalloc_backtrace_free(state,p,local_88,error_callback,data);
  return 0;
}

Assistant:

static int
elf_uncompress_lzma (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t header_size;
  size_t footer_size;
  unsigned char check;
  uint32_t computed_crc;
  uint32_t stream_crc;
  size_t offset;
  size_t index_size;
  size_t footer_offset;
  size_t index_offset;
  uint64_t index_compressed_size;
  uint64_t index_uncompressed_size;
  unsigned char *mem;
  uint16_t *probs;
  size_t compressed_block_size;

  /* The format starts with a stream header and ends with a stream
     footer.  */
  header_size = 12;
  footer_size = 12;
  if (unlikely (compressed_size < header_size + footer_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* The stream header starts with a magic string.  */
  if (unlikely (memcmp (compressed, "\375" "7zXZ\0", 6) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next come stream flags.  The first byte is zero, the second byte
     is the check.  */
  if (unlikely (compressed[6] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  check = compressed[7];
  if (unlikely ((check & 0xf8) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next comes a CRC of the stream flags.  */
  computed_crc = elf_crc32 (0, compressed + 6, 2);
  stream_crc = ((uint32_t)compressed[8]
		| ((uint32_t)compressed[9] << 8)
		| ((uint32_t)compressed[10] << 16)
		| ((uint32_t)compressed[11] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Now that we've parsed the header, parse the footer, so that we
     can get the uncompressed size.  */

  /* The footer ends with two magic bytes.  */

  offset = compressed_size;
  if (unlikely (memcmp (compressed + offset - 2, "YZ", 2) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that are the stream flags, which should be the same as the
     flags in the header.  */
  if (unlikely (compressed[offset - 2] != 0
		|| compressed[offset - 1] != check))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that is the size of the index field, which precedes the
     footer.  */
  index_size = (compressed[offset - 4]
		| (compressed[offset - 3] << 8)
		| (compressed[offset - 2] << 16)
		| (compressed[offset - 1] << 24));
  index_size = (index_size + 1) * 4;
  offset -= 4;

  /* Before that is a footer CRC.  */
  computed_crc = elf_crc32 (0, compressed + offset, 6);
  stream_crc = ((uint32_t)compressed[offset - 4]
		| ((uint32_t)compressed[offset - 3] << 8)
		| ((uint32_t)compressed[offset - 2] << 16)
		| ((uint32_t)compressed[offset - 1] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 4;

  /* The index comes just before the footer.  */
  if (unlikely (offset < index_size + header_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  footer_offset = offset;
  offset -= index_size;
  index_offset = offset;

  /* The index starts with a zero byte.  */
  if (unlikely (compressed[offset] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the number of blocks.  We expect zero blocks for an empty
     stream, and otherwise a single block.  */
  if (unlikely (compressed[offset] == 0))
    {
      *uncompressed = NULL;
      *uncompressed_size = 0;
      return 1;
    }
  if (unlikely (compressed[offset] != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the compressed size and the uncompressed size.  */
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_compressed_size))
    return 0;
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_uncompressed_size))
    return 0;

  /* Pad to a four byte boundary.  */
  offset = (offset + 3) &~ (size_t) 3;

  /* Next is a CRC of the index.  */
  computed_crc = elf_crc32 (0, compressed + index_offset,
			    offset - index_offset);
  stream_crc = ((uint32_t)compressed[offset]
		| ((uint32_t)compressed[offset + 1] << 8)
		| ((uint32_t)compressed[offset + 2] << 16)
		| ((uint32_t)compressed[offset + 3] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset += 4;

  /* We should now be back at the footer.  */
  if (unlikely (offset != footer_offset))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Allocate space to hold the uncompressed data.  If we succeed in
     uncompressing the LZMA data, we never free this memory.  */
  mem = (unsigned char *) backtrace_alloc (state, index_uncompressed_size,
					   error_callback, data);
  if (unlikely (mem == NULL))
    return 0;
  *uncompressed = mem;
  *uncompressed_size = index_uncompressed_size;

  /* Allocate space for probabilities.  */
  probs = ((uint16_t *)
	   backtrace_alloc (state,
			    LZMA_PROB_TOTAL_COUNT * sizeof (uint16_t),
			    error_callback, data));
  if (unlikely (probs == NULL))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  /* Uncompress the block, which follows the header.  */
  offset = 12;
  if (!elf_uncompress_lzma_block (compressed, compressed_size, check, probs,
				  mem, index_uncompressed_size, &offset))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  compressed_block_size = offset - 12;
  if (unlikely (compressed_block_size
		!= ((index_compressed_size + 3) &~ (size_t) 3)))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  offset = (offset + 3) &~ (size_t) 3;
  if (unlikely (offset != index_offset))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  return 1;
}